

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transactions.cpp
# Opt level: O0

RPCHelpMan * wallet::listreceivedbylabel(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffeca8;
  allocator<RPCResult> *this;
  RPCArg *this_00;
  UniValue *in_stack_ffffffffffffecb0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffecb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffecc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffecd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffece0;
  UniValue *in_stack_ffffffffffffece8;
  char *in_stack_ffffffffffffecf0;
  undefined7 in_stack_ffffffffffffecf8;
  undefined1 in_stack_ffffffffffffecff;
  string *in_stack_ffffffffffffed00;
  undefined7 in_stack_ffffffffffffed08;
  undefined1 in_stack_ffffffffffffed0f;
  undefined4 in_stack_ffffffffffffed10;
  Type in_stack_ffffffffffffed14;
  string *in_stack_ffffffffffffed18;
  undefined4 in_stack_ffffffffffffed20;
  Type in_stack_ffffffffffffed24;
  undefined4 in_stack_ffffffffffffed28;
  Type in_stack_ffffffffffffed2c;
  RPCResult *in_stack_ffffffffffffed30;
  undefined1 *local_12b8;
  undefined1 *local_12a0;
  RPCMethodImpl *local_1288;
  RPCExamples *examples;
  pointer *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_01;
  RPCMethodImpl *fun;
  undefined1 local_10a0 [33];
  allocator<char> local_107f;
  allocator<char> local_107e;
  allocator<char> local_107d;
  allocator<char> local_107c;
  allocator<char> local_107b [3];
  pointer local_1078;
  pointer pRStack_1070;
  pointer local_1068;
  allocator<char> local_105a;
  allocator<char> local_1059 [31];
  undefined1 local_103a;
  undefined1 local_1039 [31];
  undefined1 local_101a [26];
  _Alloc_hider local_1000;
  allocator<char> local_ff2;
  allocator<char> local_ff1 [31];
  allocator<char> local_fd2;
  allocator<char> local_fd1 [31];
  allocator<char> local_fb2;
  allocator<char> local_fb1 [31];
  allocator<char> local_f92;
  undefined1 local_f91;
  allocator<char> local_f90;
  allocator<char> local_f8f;
  allocator<char> local_f8e;
  allocator<char> local_f8d;
  allocator<char> local_f8c;
  undefined1 local_f8b;
  allocator<char> local_f8a;
  allocator<char> local_f89;
  undefined4 local_f88;
  allocator<char> local_f81 [31];
  allocator<char> local_f62;
  allocator<char> local_f61 [641];
  undefined1 local_ce0 [136];
  RPCHelpMan local_c58 [2];
  undefined1 local_ac0 [64];
  RPCMethodImpl local_a80 [4];
  RPCMethodImpl local_9f8 [6];
  undefined1 local_930;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined1 local_8f0;
  undefined1 local_8ef;
  undefined1 local_7f0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined1 local_7b0;
  undefined1 local_7af;
  undefined1 local_6e8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined1 local_6a8;
  undefined1 local_6a7;
  undefined1 local_5a8;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined1 local_568;
  undefined1 local_567;
  undefined1 local_468 [1056];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000._M_p = (pointer)0x0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  local_f88 = 1;
  UniValue::UniValue<int,_int,_true>(in_stack_ffffffffffffece8,(int *)in_stack_ffffffffffffece0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffecb8,in_stack_ffffffffffffecb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  local_5a8 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffecc0);
  local_580 = 0;
  uStack_578 = 0;
  local_570 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffeca8);
  local_568 = 0;
  local_567 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
                 in_stack_ffffffffffffed18,in_stack_ffffffffffffed14,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffed0f,in_stack_ffffffffffffed08),
                 in_stack_ffffffffffffed00,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  local_f8b = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffece8,(bool *)in_stack_ffffffffffffece0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffecb8,in_stack_ffffffffffffecb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  local_6e8 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffecc0);
  local_6c0 = 0;
  uStack_6b8 = 0;
  local_6b0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffeca8);
  local_6a8 = 0;
  local_6a7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
                 in_stack_ffffffffffffed18,in_stack_ffffffffffffed14,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffed0f,in_stack_ffffffffffffed08),
                 in_stack_ffffffffffffed00,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffecb8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffecb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  local_7f0 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffecc0);
  local_7c8 = 0;
  uStack_7c0 = 0;
  local_7b8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffeca8);
  local_7b0 = 0;
  local_7af = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
                 in_stack_ffffffffffffed18,in_stack_ffffffffffffed14,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffed0f,in_stack_ffffffffffffed08),
                 in_stack_ffffffffffffed00,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  local_f91 = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffece8,(bool *)in_stack_ffffffffffffece0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffecb8,in_stack_ffffffffffffecb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  local_930 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffecc0);
  local_908 = 0;
  uStack_900 = 0;
  local_8f8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffeca8);
  local_8f0 = 0;
  local_8ef = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
                 in_stack_ffffffffffffed18,in_stack_ffffffffffffed14,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffed0f,in_stack_ffffffffffffed08),
                 in_stack_ffffffffffffed00,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffeca8);
  __l._M_len._0_7_ = in_stack_ffffffffffffecf8;
  __l._M_array = (iterator)in_stack_ffffffffffffecf0;
  __l._M_len._7_1_ = in_stack_ffffffffffffecff;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffece8,__l,
             (allocator_type *)in_stack_ffffffffffffece0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  local_101a._2_8_ = 0;
  local_101a._10_8_ = 0;
  local_101a._18_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeca8);
  this = (allocator<RPCResult> *)((ulong)in_stack_ffffffffffffeca8 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),
             in_stack_ffffffffffffed24,in_stack_ffffffffffffed18,
             SUB41(in_stack_ffffffffffffed14 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffed0f,in_stack_ffffffffffffed08),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed00,
             (bool)in_stack_ffffffffffffecff);
  this_01 = local_c58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  name = (string *)local_101a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  local_1039._1_8_ = 0;
  local_1039._9_8_ = 0;
  local_1039._17_8_ = 0;
  description = (string *)(local_1039 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            (in_stack_ffffffffffffed30,in_stack_ffffffffffffed2c,
             (string *)CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
             in_stack_ffffffffffffed18,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
             (bool)in_stack_ffffffffffffed0f);
  results = (pointer *)
            ((long)&local_c58[0].m_results.m_results.
                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data + 0x10);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)local_1039;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  examples = (RPCExamples *)&local_103a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  local_1059[1] = (allocator<char>)0x0;
  local_1059[2] = (allocator<char>)0x0;
  local_1059[3] = (allocator<char>)0x0;
  local_1059[4] = (allocator<char>)0x0;
  local_1059[5] = (allocator<char>)0x0;
  local_1059[6] = (allocator<char>)0x0;
  local_1059[7] = (allocator<char>)0x0;
  local_1059[8] = (allocator<char>)0x0;
  local_1059[9] = (allocator<char>)0x0;
  local_1059[10] = (allocator<char>)0x0;
  local_1059[0xb] = (allocator<char>)0x0;
  local_1059[0xc] = (allocator<char>)0x0;
  local_1059[0xd] = (allocator<char>)0x0;
  local_1059[0xe] = (allocator<char>)0x0;
  local_1059[0xf] = (allocator<char>)0x0;
  local_1059[0x10] = (allocator<char>)0x0;
  local_1059[0x11] = (allocator<char>)0x0;
  local_1059[0x12] = (allocator<char>)0x0;
  local_1059[0x13] = (allocator<char>)0x0;
  local_1059[0x14] = (allocator<char>)0x0;
  local_1059[0x15] = (allocator<char>)0x0;
  local_1059[0x16] = (allocator<char>)0x0;
  local_1059[0x17] = (allocator<char>)0x0;
  local_1059[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            (in_stack_ffffffffffffed30,in_stack_ffffffffffffed2c,
             (string *)CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
             in_stack_ffffffffffffed18,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
             (bool)in_stack_ffffffffffffed0f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  local_1078 = (pointer)0x0;
  pRStack_1070 = (pointer)0x0;
  local_1068 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            (in_stack_ffffffffffffed30,in_stack_ffffffffffffed2c,
             (string *)CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
             in_stack_ffffffffffffed18,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
             (bool)in_stack_ffffffffffffed0f);
  std::allocator<RPCResult>::allocator(this);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffecf8;
  __l_00._M_array = (iterator)in_stack_ffffffffffffecf0;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffecff;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffece8,__l_00,
             (allocator_type *)in_stack_ffffffffffffece0);
  RPCResult::RPCResult
            (in_stack_ffffffffffffed30,in_stack_ffffffffffffed2c,
             (string *)CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
             in_stack_ffffffffffffed18,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
             (bool)in_stack_ffffffffffffed0f);
  fun = local_a80;
  std::allocator<RPCResult>::allocator(this);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffecf8;
  __l_01._M_array = (iterator)in_stack_ffffffffffffecf0;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffecff;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffece8,__l_01,
             (allocator_type *)in_stack_ffffffffffffece0);
  RPCResult::RPCResult
            (in_stack_ffffffffffffed30,in_stack_ffffffffffffed2c,
             (string *)CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
             in_stack_ffffffffffffed18,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffed14,in_stack_ffffffffffffed10),
             (bool)in_stack_ffffffffffffed0f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  HelpExampleCli(in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  HelpExampleCli(in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8);
  std::operator+(in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffecff,in_stack_ffffffffffffecf8),in_stack_ffffffffffffecf0
             ,(allocator<char> *)in_stack_ffffffffffffece8);
  HelpExampleRpc(in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8);
  std::operator+(in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0xccae37);
  this_00 = (RPCArg *)local_10a0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::listreceivedbylabel()::__0,void>
            (in_stack_ffffffffffffecb8,(anon_class_1_0_00000001 *)in_stack_ffffffffffffecb0);
  RPCHelpMan::RPCHelpMan(this_01,name,description,args,(RPCResults *)results,examples,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_10a0 + 0x20));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_107f);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_107e);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_107d);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_107c);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_107b);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult((RPCResult *)this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffecb8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_1288 = local_9f8;
  do {
    local_1288 = (RPCMethodImpl *)&local_1288[-5]._M_invoker;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_1288 != local_a80);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffecb8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_12a0 = local_ac0;
  do {
    local_12a0 = local_12a0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_12a0 != local_ce0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffecb8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_105a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1059);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffecb8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_103a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_1039);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffecb8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_101a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_101a + 1));
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffecb8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_ff2);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_ff1);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_fd2);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_fd1);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_fb2);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_fb1);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffecb8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_12b8 = local_48;
  do {
    local_12b8 = local_12b8 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_12b8 != local_468);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_f92);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_f90);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_f8f);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_f8e);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_f8d);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_f8c);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_f8a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_f89);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_f81);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_f62);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_f61);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan listreceivedbylabel()
{
    return RPCHelpMan{"listreceivedbylabel",
                "\nList received transactions by label.\n",
                {
                    {"minconf", RPCArg::Type::NUM, RPCArg::Default{1}, "The minimum number of confirmations before payments are included."},
                    {"include_empty", RPCArg::Type::BOOL, RPCArg::Default{false}, "Whether to include labels that haven't received any payments."},
                    {"include_watchonly", RPCArg::Type::BOOL, RPCArg::DefaultHint{"true for watch-only wallets, otherwise false"}, "Whether to include watch-only addresses (see 'importaddress')"},
                    {"include_immature_coinbase", RPCArg::Type::BOOL, RPCArg::Default{false}, "Include immature coinbase transactions."},
                },
                RPCResult{
                    RPCResult::Type::ARR, "", "",
                    {
                        {RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::BOOL, "involvesWatchonly", /*optional=*/true, "Only returns true if imported addresses were involved in transaction"},
                            {RPCResult::Type::STR_AMOUNT, "amount", "The total amount received by addresses with this label"},
                            {RPCResult::Type::NUM, "confirmations", "The number of confirmations of the most recent transaction included"},
                            {RPCResult::Type::STR, "label", "The label of the receiving address. The default label is \"\""},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("listreceivedbylabel", "")
            + HelpExampleCli("listreceivedbylabel", "6 true")
            + HelpExampleRpc("listreceivedbylabel", "6, true, true, true")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    pwallet->BlockUntilSyncedToCurrentChain();

    const bool include_immature_coinbase{request.params[3].isNull() ? false : request.params[3].get_bool()};

    LOCK(pwallet->cs_wallet);

    return ListReceived(*pwallet, request.params, true, include_immature_coinbase);
},
    };
}